

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O3

result_type_conflict3 * __thiscall
trng::student_t_dist<long_double>::icdf_
          (result_type_conflict3 *__return_storage_ptr__,student_t_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *prVar1;
  longdouble in_ST0;
  longdouble x_00;
  
  x_00 = (longdouble)*(int *)__return_storage_ptr__ * (longdouble)0.5;
  math::detail::Beta<long_double>((longdouble *)__return_storage_ptr__,x_00,x_00);
  math::detail::inv_Beta_I<long_double>
            ((longdouble *)__return_storage_ptr__,x._0_10_,x_00,x_00,in_ST0);
  prVar1 = (result_type_conflict3 *)sqrtl();
  return prVar1;
}

Assistant:

icdf_(result_type x) const {
      const result_type t{
          math::inv_Beta_I(x, P.nu() / result_type(2), P.nu() / result_type(2))};
      return math::sqrt(P.nu() / (t * (1 - t))) * (t - result_type(1) / result_type(2));
    }